

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O2

void * sx__malloc_cb(void *ptr,size_t size,uint32_t align,char *file,char *func,uint32_t line,
                    void *user_data)

{
  void *pvVar1;
  
  if (size == 0) {
    if (ptr != (void *)0x0) {
      if (align < 9) {
        free(ptr);
      }
      else {
        sx__aligned_free(&g_alloc_malloc,ptr,file,func,line);
      }
    }
    pvVar1 = (void *)0x0;
  }
  else {
    if (ptr == (void *)0x0) {
      if (align < 9) {
        pvVar1 = malloc(size);
        return pvVar1;
      }
      pvVar1 = sx__aligned_alloc(&g_alloc_malloc,size,align,file,func,line);
      return pvVar1;
    }
    if (align < 9) {
      pvVar1 = realloc(ptr,size);
      return pvVar1;
    }
    pvVar1 = sx__aligned_realloc(&g_alloc_malloc,ptr,size,align,file,func,line);
  }
  return pvVar1;
}

Assistant:

static void* sx__malloc_cb(void* ptr, size_t size, uint32_t align, const char* file,
                           const char* func, uint32_t line, void* user_data)
{
    sx_unused(user_data);
    sx_unused(line);
    sx_unused(func);
    sx_unused(file);

    if (size == 0) {
        if (ptr) {
            if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT) {
                free(ptr);
                return NULL;
            }

#if SX_COMPILER_MSVC
            _aligned_free(ptr);
#else
            sx__aligned_free(&g_alloc_malloc, ptr, file, func, line);
#endif
        }
        return NULL;
    } else if (ptr == NULL) {
        if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT)
            return malloc(size);

#if SX_COMPILER_MSVC
        return _aligned_malloc(size, align);
#else
        return sx__aligned_alloc(&g_alloc_malloc, size, align, file, func, line);
#endif
    } else {
        if (align <= SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT)
            return realloc(ptr, size);

#if SX_COMPILER_MSVC
        return _aligned_realloc(ptr, size, align);
#else
        return sx__aligned_realloc(&g_alloc_malloc, ptr, size, align, file, func, line);
#endif
    }
}